

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

void __thiscall
soplex::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::memPack(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  uint uVar1;
  DLPSV *pDVar2;
  DLPSV *pDVar3;
  ulong uVar4;
  int newsize;
  long lVar5;
  
  newsize = 0;
  pDVar2 = (this->list).
           super_IsList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           .the_first;
  while (pDVar3 = pDVar2, pDVar3 != (DLPSV *)0x0) {
    uVar1 = (pDVar3->
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).memused;
    if ((pDVar3->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_elem ==
        (this->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ).data + newsize) {
      (pDVar3->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).memsize = uVar1;
    }
    else {
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      for (lVar5 = 0; uVar4 * 0x84 - lVar5 != 0; lVar5 = lVar5 + 0x84) {
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)(this->
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ).data[newsize].val.m_backend.data._M_elems + lVar5),
                    (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)(((pDVar3->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).m_elem)->val).m_backend.data._M_elems + lVar5));
      }
      (pDVar3->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).m_elem = (this->
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ).data + newsize;
      (pDVar3->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).memsize = uVar1;
      (pDVar3->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).memused = uVar1;
    }
    newsize = newsize + uVar1;
    pDVar2 = (DLPSV *)0x0;
    if ((this->list).
        super_IsList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
        .the_last != pDVar3) {
      pDVar2 = pDVar3->thenext;
    }
  }
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ,newsize);
  this->unusedMem = 0;
  this->numUnusedMemUpdates = 0;
  return;
}

Assistant:

void memPack()
   {
      DLPSV* ps;
      int used;
      int j;

      for(used = 0, ps = list.first(); ps; ps = list.next(ps))
      {
         const int sz = ps->size();

         if(ps->mem() != &this->SVSetBaseArray::operator[](used))
         {
            // cannot use memcpy, because the memory might overlap
            for(j = 0; j < sz; ++j)
               this->SVSetBaseArray::operator[](used + j) = ps->mem()[j];

            ps->setMem(sz, &this->SVSetBaseArray::operator[](used));
            ps->set_size(sz);
         }
         else
            ps->set_max(sz);

         used += sz;
      }

#ifdef SOPLEX_DEBUG
      SPxOut::debug(this,
                    "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n", unusedMem,
                    numUnusedMemUpdates, (void*)this);
      SPxOut::debug(this,
                    "               --> NEW: unusedMem = {}, zero after memPack() at memMax() = {}\n",
                    memSize() - used, memMax());
#endif
#ifndef NDEBUG
      Nonzero<R>* olddata = SVSetBaseArray::data;
      SVSetBaseArray::reSize(used);
      assert(olddata == SVSetBaseArray::data);
#else
      SVSetBaseArray::reSize(used);
#endif

      unusedMem = 0;
      numUnusedMemUpdates = 0;
   }